

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O2

void Amap_LibertyWipeOutComments(char *pBeg,char *pEnd)

{
  char *pcVar1;
  char *pCur;
  
  while( true ) {
    if (pEnd <= pBeg) {
      return;
    }
    pcVar1 = pBeg;
    if ((*pBeg == '/') && (pBeg[1] == '*')) break;
LAB_003390a5:
    pBeg = pcVar1 + 1;
  }
LAB_00339077:
  if (pcVar1 < pEnd) {
    if ((*pcVar1 != '*') || (pcVar1[1] != '/')) goto LAB_00339087;
    for (; pBeg < pcVar1 + 2; pBeg = pBeg + 1) {
      if (*pBeg != '\n') {
        *pBeg = ' ';
      }
    }
  }
  goto LAB_003390a5;
LAB_00339087:
  pcVar1 = pcVar1 + 1;
  goto LAB_00339077;
}

Assistant:

void Amap_LibertyWipeOutComments( char * pBeg, char * pEnd )
{
    char * pCur, * pStart;
    for ( pCur = pBeg; pCur < pEnd; pCur++ )
    if ( pCur[0] == '/' && pCur[1] == '*' )
        for ( pStart = pCur; pCur < pEnd; pCur++ )
        if ( pCur[0] == '*' && pCur[1] == '/' )
        {
            for ( ; pStart < pCur + 2; pStart++ )
            if ( *pStart != '\n' ) *pStart = ' ';
            break;
        }
}